

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AtomEscapePass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  EncodedChar EVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  Char *pCVar10;
  Node *pNVar11;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar12;
  uint uVar13;
  ulong uVar14;
  Char CVar15;
  Char *pCVar16;
  Char CVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong local_68;
  ulong local_58;
  Char local_3a;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPStack_38;
  Char c;
  
  pCVar10 = this->inputLim;
  pCVar16 = this->next;
  pPStack_38 = this;
  if (pCVar10 <= pCVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar4) goto LAB_00eb9d2d;
    *puVar8 = 0;
    pCVar10 = pPStack_38->inputLim;
    pCVar16 = pPStack_38->next;
  }
  if (pCVar10 < pCVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00eb9d2d;
    *puVar8 = 0;
    pCVar16 = pPStack_38->next;
  }
  uVar14 = (ulong)(ushort)*pCVar16;
  if (uVar14 < 0x100) {
    pCVar10 = pPStack_38->inputLim;
    if ((ASCIIChars::classes[uVar14] & 0x10) != 0) {
      if (pCVar10 < pCVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00eb9d2d;
        *puVar8 = 0;
        pCVar16 = pPStack_38->next;
        uVar14 = (ulong)(ushort)*pCVar16;
      }
      uVar9 = 0x30;
      pPVar12 = pPStack_38;
      if ((short)uVar14 != 0x30) {
        local_58 = 0;
        local_68 = 1;
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        iVar19 = 0;
        pPVar12 = pPStack_38;
        lVar3 = 4;
        do {
          lVar20 = lVar3;
          if (pPVar12->inputLim < (EncodedChar *)((long)pCVar16 + lVar20 + -4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            uVar14 = (ulong)*(ushort *)((long)pCVar16 + lVar20 + -4);
            pPVar12 = pPStack_38;
          }
          uVar6 = 0;
          if ((uint)uVar14 < 0x100) {
            uVar6 = (uint)(byte)ASCIIChars::values[uVar14];
          }
          iVar19 = iVar19 * 10 + uVar6;
          if (lVar20 == 0xc) {
            uVar9 = 5;
            break;
          }
          local_58 = local_58 + 1;
          uVar9 = local_58;
          if (pPVar12->inputLim < (EncodedChar *)(lVar20 + (long)pCVar16)) break;
          if (pPVar12->inputLim < (EncodedChar *)((long)pCVar16 + lVar20 + -2)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          uVar14 = (ulong)*(ushort *)((long)pCVar16 + lVar20 + -2);
          uVar9 = local_68;
          if (0xff < uVar14) break;
          local_68 = local_68 + 1;
          lVar3 = lVar20 + 2;
          uVar9 = local_58;
        } while ((ASCIIChars::classes[uVar14] & 0x10) != 0);
        local_58 = uVar9;
        pCVar10 = pPVar12->inputLim;
        if (iVar19 < (int)(uint)pPVar12->numGroups) {
          local_58 = local_58 & 0xffffffff;
          if ((Char *)(lVar20 + (long)pCVar16) <= pCVar10) {
            if (pCVar10 < pCVar16 + local_58) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar4) goto LAB_00eb9d2d;
              *puVar8 = 0;
              pCVar16 = pPStack_38->next;
              pPVar12 = pPStack_38;
            }
            if ((ulong)(ushort)pCVar16[local_58] < 0x100) {
              pCVar10 = pPVar12->inputLim;
              if ((ASCIIChars::classes[(ushort)pCVar16[local_58]] & 0x10) != 0) goto LAB_00eb9649;
            }
            else {
              pCVar10 = pPVar12->inputLim;
            }
          }
          if (pCVar10 < pCVar16 + local_58) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          pPVar12->next = pCVar16 + local_58;
          pNVar11 = (Node *)new<Memory::ArenaAllocator>(0x40,pPVar12->ctAllocator,0x364470);
          pNVar11->tag = MatchGroup;
          pNVar11->features = 0;
          *(uint *)&pNVar11->field_0xc = *(uint *)&pNVar11->field_0xc & 0xffff8000;
          pNVar11->firstSet = (CharSet<char16_t> *)0x0;
          pNVar11->followSet = (CharSet<char16_t> *)0x0;
          (pNVar11->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar11->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar11->thisConsumes).upper = 0xffffffff;
          (pNVar11->followConsumes).upper = 0xffffffff;
          pNVar11->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542e70;
          *(int *)&pNVar11[1]._vptr_Node = iVar19;
          *node = pNVar11;
          return false;
        }
LAB_00eb9649:
        if (pCVar10 < pCVar16) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar4) goto LAB_00eb9d2d;
          *puVar8 = 0;
          pCVar16 = pPStack_38->next;
          pPVar12 = pPStack_38;
        }
        CVar15 = *pCVar16;
        uVar9 = (ulong)(ushort)CVar15;
        if ((0xff < uVar9) || ((ASCIIChars::classes[uVar9] & 0x20) == 0)) {
          pCVar10 = pPVar12->inputLim;
          if (pCVar10 < pCVar16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar10 = pPStack_38->inputLim;
            pCVar16 = pPStack_38->next;
            CVar15 = *pCVar16;
            pPVar12 = pPStack_38;
          }
          deferredCharNode->cs[0] = CVar15;
          if (pCVar16 + 1 <= pCVar10) {
LAB_00eb977a:
            pPVar12->next = pCVar16 + 1;
            *node = &deferredCharNode->super_Node;
            return false;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (bVar4) {
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
            goto LAB_00eb977a;
          }
          goto LAB_00eb9d2d;
        }
      }
      if (pPVar12->inputLim < pCVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00eb9d2d;
        *puVar8 = 0;
        pCVar16 = pPStack_38->next;
        uVar9 = (ulong)(ushort)*pCVar16;
        if ((ushort)*pCVar16 < 0x100) goto LAB_00eb8f1e;
      }
      else {
LAB_00eb8f1e:
        if ((ASCIIChars::classes[uVar9] & 0x20) != 0) {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          goto LAB_00eb9416;
        }
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (bVar4) {
        *puVar8 = 0;
        pCVar16 = pPStack_38->next;
LAB_00eb9416:
        iVar19 = 3;
        pPVar12 = pPStack_38;
        uVar6 = 0;
        while( true ) {
          if (pPVar12->inputLim < pCVar16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          uVar13 = 0;
          if ((ulong)(ushort)*pCVar16 < 0x100) {
            uVar13 = (uint)(byte)ASCIIChars::values[(ushort)*pCVar16];
          }
          uVar13 = uVar6 * 8 + uVar13;
          if (0xff < uVar13) break;
          if (pPVar12->inputLim < pCVar16 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          pCVar16 = pCVar16 + 1;
          pPVar12->next = pCVar16;
          iVar19 = iVar19 + -1;
          uVar6 = uVar13;
          if (iVar19 == 0) break;
          if (pPVar12->inputLim < pCVar16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar4) goto LAB_00eb9d2d;
            *puVar8 = 0;
            pCVar16 = pPStack_38->next;
            pPVar12 = pPStack_38;
          }
          if ((0xff < (ulong)(ushort)*pCVar16) ||
             ((ASCIIChars::classes[(ushort)*pCVar16] & 0x20) == 0)) break;
        }
        deferredCharNode->cs[0] = (Char)uVar6;
        *node = &deferredCharNode->super_Node;
        return false;
      }
      goto LAB_00eb9d2d;
    }
  }
  else {
    pCVar10 = pPStack_38->inputLim;
  }
  if (pCVar10 < pCVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) goto LAB_00eb9d2d;
    *puVar8 = 0;
    pCVar16 = pPStack_38->next;
    uVar14 = (ulong)(ushort)*pCVar16;
  }
  if ((short)uVar14 == 99) {
    if (pPStack_38->inputLim < pCVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar4) goto LAB_00eb9d2d;
      *puVar8 = 0;
      pCVar16 = pPStack_38->next;
    }
    CVar15 = pCVar16[1];
    CVar17 = L'\\';
    if (((ulong)(ushort)CVar15 < 0x100) && ((ASCIIChars::classes[(ushort)CVar15] & 8) != 0)) {
      pCVar10 = pPStack_38->inputLim;
      if (pCVar10 < pCVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00eb9d2d;
        *puVar8 = 0;
        pCVar10 = pPStack_38->inputLim;
        pCVar16 = pPStack_38->next;
        CVar15 = pCVar16[1];
      }
      if (pCVar10 < pCVar16 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar4) goto LAB_00eb9d2d;
        *puVar8 = 0;
        pCVar16 = pPStack_38->next;
      }
      CVar17 = CVar15 & 0x1f;
      pPStack_38->next = pCVar16 + 2;
    }
    deferredCharNode->cs[0] = CVar17;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (pPStack_38->inputLim <= pCVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar4) {
LAB_00eb9d2d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
    pCVar16 = pPStack_38->next;
    uVar14 = (ulong)(ushort)*pCVar16;
  }
  pPStack_38->next = pCVar16 + 1;
  CVar15 = (Char)uVar14;
  uVar6 = (uint)uVar14;
  if (uVar6 < 0x100) {
    if ((ASCIIChars::classes[uVar14] & 2) != 0) {
LAB_00eb922f:
      Fail(pPStack_38,-0x7ff5fc0c);
    }
  }
  else if ((uVar6 & 0xfffe) == 0x2028) goto LAB_00eb922f;
  pPVar12 = pPStack_38;
  local_3a = CVar15;
  switch(uVar6) {
  case 0x53:
    EVar5 = L'S';
    goto LAB_00eb9c7b;
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x79:
  case 0x7a:
    goto switchD_00eb925c_caseD_54;
  case 0x57:
    EVar5 = L'W';
LAB_00eb9c7b:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(pPStack_38,EVar5);
    goto LAB_00eb928c;
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    break;
  case 0x62:
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,pPStack_38->ctAllocator,0x364470);
    (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
    (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
    puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper = 0xffffffff
    ;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper = 0xffffffff
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
    (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
         (_func_int **)&PTR_LiteralLength_01542850;
    ((MatchSetNode *)deferredCharNode)->isNegation = false;
    ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
LAB_00eb9d07:
    ((MatchSetNode *)deferredCharNode)->field_0x3a = 0;
    bVar4 = true;
    goto LAB_00eb928f;
  case 100:
    bVar4 = false;
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (pPVar12->standardChars,pPVar12->ctAllocator,&((MatchSetNode *)deferredCharNode)->set)
    ;
    goto LAB_00eb928f;
  case 0x66:
    local_3a = L'\f';
    break;
  case 0x6e:
    local_3a = L'\n';
    break;
  case 0x72:
    local_3a = L'\r';
    break;
  case 0x73:
    bVar4 = false;
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (pPVar12->standardChars,pPVar12->ctAllocator,&((MatchSetNode *)deferredCharNode)->set)
    ;
    goto LAB_00eb928f;
  case 0x74:
    local_3a = L'\t';
    break;
  case 0x75:
    if (((pPStack_38->unicodeFlagPresent != true) ||
        (iVar19 = TryParseExtendedUnicodeEscape(pPStack_38,&local_3a,previousSurrogatePart,false),
        iVar19 < 1)) && (pPStack_38->next + 4 <= pPStack_38->inputLim)) {
      EVar5 = ECLookahead(pPStack_38,0);
      if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
        EVar5 = ECLookahead(pPStack_38,1);
        if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
          EVar5 = ECLookahead(pPStack_38,2);
          if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
            EVar5 = ECLookahead(pPStack_38,3);
            if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
              uVar6 = 0;
              EVar5 = ECLookahead(pPStack_38,0);
              uVar13 = 0;
              if ((ushort)EVar5 < 0x100) {
                uVar13 = (uint)(byte)ASCIIChars::values[(ushort)EVar5] << 0xc;
              }
              EVar5 = ECLookahead(pPStack_38,1);
              if ((ushort)EVar5 < 0x100) {
                uVar6 = (uint)(byte)ASCIIChars::values[(ushort)EVar5] << 8;
              }
              EVar5 = ECLookahead(pPStack_38,2);
              uVar18 = 0;
              uVar7 = 0;
              if ((ushort)EVar5 < 0x100) {
                uVar7 = (uint)(byte)ASCIIChars::values[(ushort)EVar5] << 4;
              }
              EVar5 = ECLookahead(pPStack_38,3);
              if ((ushort)EVar5 < 0x100) {
                uVar18 = (uint)(byte)ASCIIChars::values[(ushort)EVar5];
              }
              local_3a = Chars<char16_t>::UTC(uVar6 | uVar13 | uVar7 | uVar18);
              ECConsume(pPStack_38,4);
            }
          }
        }
      }
    }
    break;
  case 0x76:
    local_3a = L'\v';
    break;
  case 0x77:
    deferredCharNode =
         (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,pPStack_38->ctAllocator,0x364470);
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((pPStack_38->unicodeFlagPresent == true) && (pPStack_38->caseInsensitiveFlagPresent == true)
       ) {
      StandardChars<char16_t>::SetWordIUChars
                (pPStack_38->standardChars,pPStack_38->ctAllocator,
                 &((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (pPStack_38->standardChars,pPStack_38->ctAllocator,
                 &((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00eb928c;
  case 0x78:
    if (pPStack_38->next + 2 <= pPStack_38->inputLim) {
      EVar5 = ECLookahead(pPStack_38,0);
      if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
        EVar5 = ECLookahead(pPStack_38,1);
        if (((ushort)EVar5 < 0x100) && ((ASCIIChars::classes[(ushort)EVar5] & 0x40) != 0)) {
          uVar6 = 0;
          EVar5 = ECLookahead(pPStack_38,0);
          uVar13 = 0;
          if ((ushort)EVar5 < 0x100) {
            uVar13 = (uint)(byte)ASCIIChars::values[(ushort)EVar5] << 4;
          }
          EVar5 = ECLookahead(pPStack_38,1);
          if ((ushort)EVar5 < 0x100) {
            uVar6 = (uint)(byte)ASCIIChars::values[(ushort)EVar5];
          }
          local_3a = Chars<char16_t>::UTC(uVar6 | uVar13);
          ECConsume(pPStack_38,2);
        }
      }
    }
    break;
  default:
    uVar14 = (ulong)(uVar6 - 0x24);
    if (uVar6 - 0x24 < 0x21) {
      if ((0x8000cf1UL >> (uVar14 & 0x3f) & 1) != 0) break;
      if (uVar14 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,pPStack_38->ctAllocator,0x364470);
        (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
        (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
        puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper =
             0xffffffff;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper =
             0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
             (_func_int **)&PTR_LiteralLength_01542850;
        ((MatchSetNode *)deferredCharNode)->isNegation = true;
        ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
        goto LAB_00eb9d07;
      }
      if (uVar14 == 0x20) {
        EVar5 = L'D';
        goto LAB_00eb9c7b;
      }
    }
    goto switchD_00eb925c_caseD_54;
  }
switchD_00eb925c_caseD_5b:
  deferredCharNode->cs[0] = local_3a;
LAB_00eb928c:
  bVar4 = false;
LAB_00eb928f:
  *node = &deferredCharNode->super_Node;
  return bVar4;
switchD_00eb925c_caseD_54:
  if (pPStack_38->unicodeFlagPresent == true) {
    Fail(pPStack_38,-0x7ff5e9d6);
  }
  goto switchD_00eb925c_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }